

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractConsumerStage.h
# Opt level: O3

void __thiscall
teetime::
AbstractConsumerStage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::execute(AbstractConsumerStage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  Pipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pPVar1;
  int iVar2;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  char local_18;
  
  if (this->m_inputport ==
      (InputPort<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
      )0x0) {
    __assert_fail("m_inputport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/../include/teetime/stages/AbstractConsumerStage.h"
                  ,0x41,
                  "virtual void teetime::AbstractConsumerStage<std::basic_string<char>>::execute() [T = std::basic_string<char>]"
                 );
  }
  (*(this->m_inputport->m_pipe->super_AbstractPipe)._vptr_AbstractPipe[4])(local_38);
  if (local_18 == '\x01') {
    (*(this->super_AbstractStage)._vptr_AbstractStage[4])(this,local_38);
  }
  else {
    pPVar1 = this->m_inputport->m_pipe;
    if (((pPVar1->super_AbstractPipe).m_closed._M_base._M_i & 1U) != 0) {
      iVar2 = (*(pPVar1->super_AbstractPipe)._vptr_AbstractPipe[7])();
      if ((char)iVar2 != '\0') {
        AbstractStage::terminate(&this->super_AbstractStage);
        goto LAB_0011b364;
      }
    }
    sched_yield();
  }
LAB_0011b364:
  if ((local_18 == '\x01') && (local_38[0] != local_28)) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

virtual void execute() override final
    {
      assert(m_inputport);

      //TEETIME_DEBUG() << "'execute' stage";
      auto v = m_inputport->receive();
      if(v)
      {
        execute(std::move(*v));
      }
      else if(m_inputport->isClosed())
      {
        terminate();
      }
      else
      {
        std::this_thread::yield();
      }
    }